

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

unsigned_long __thiscall
el::base::TypedConfigurations::getULong(TypedConfigurations *this,string *confVal)

{
  char *pcVar1;
  ulong uVar2;
  char *__nptr;
  ostream *poVar3;
  unsigned_long uVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  stringstream internalInfoStream;
  long *local_1b8;
  long local_1b0;
  long local_1a8 [2];
  stringstream local_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  utils::Str::rtrim(confVal);
  utils::Str::ltrim(confVal);
  uVar2 = confVal->_M_string_length;
  if (uVar2 == 0) goto LAB_0015e711;
  __nptr = (confVal->_M_dataplus)._M_p;
  pcVar1 = __nptr + uVar2;
  pcVar5 = __nptr;
  if (0 < (long)uVar2 >> 2) {
    pcVar5 = __nptr + (uVar2 & 0xfffffffffffffffc);
    lVar7 = ((long)uVar2 >> 2) + 1;
    pcVar6 = __nptr + 3;
    do {
      if ((byte)(pcVar6[-3] - 0x3aU) < 0xf6) {
        pcVar6 = pcVar6 + -3;
        goto LAB_0015e708;
      }
      if ((byte)(pcVar6[-2] - 0x3aU) < 0xf6) {
        pcVar6 = pcVar6 + -2;
        goto LAB_0015e708;
      }
      if ((byte)(pcVar6[-1] - 0x3aU) < 0xf6) {
        pcVar6 = pcVar6 + -1;
        goto LAB_0015e708;
      }
      if ((byte)(*pcVar6 - 0x3aU) < 0xf6) goto LAB_0015e708;
      lVar7 = lVar7 + -1;
      pcVar6 = pcVar6 + 4;
    } while (1 < lVar7);
  }
  lVar7 = (long)pcVar1 - (long)pcVar5;
  if (lVar7 == 1) {
LAB_0015e6e8:
    pcVar6 = pcVar5;
    if (0xf5 < (byte)(*pcVar5 - 0x3aU)) {
      pcVar6 = pcVar1;
    }
  }
  else if (lVar7 == 2) {
LAB_0015e6db:
    pcVar6 = pcVar5;
    if (0xf5 < (byte)(*pcVar5 - 0x3aU)) {
      pcVar5 = pcVar5 + 1;
      goto LAB_0015e6e8;
    }
  }
  else {
    pcVar6 = pcVar1;
    if ((lVar7 == 3) && (pcVar6 = pcVar5, 0xf5 < (byte)(*pcVar5 - 0x3aU))) {
      pcVar5 = pcVar5 + 1;
      goto LAB_0015e6db;
    }
  }
LAB_0015e708:
  if (pcVar6 == pcVar1) {
    uVar4 = atol(__nptr);
    return uVar4;
  }
LAB_0015e711:
  std::__cxx11::stringstream::stringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_188,"Configuration value not a valid integer [",0x29);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_188,(confVal->_M_dataplus)._M_p,confVal->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ",0x2c);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x677);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,") [valid",8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] WITH MESSAGE \"",0x10);
  std::__cxx11::stringbuf::str();
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_1b8,local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8,local_1a8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  return 0;
}

Assistant:

unsigned long TypedConfigurations::getULong(std::string confVal) {
  bool valid = true;
  base::utils::Str::trim(confVal);
  valid = !confVal.empty() && std::find_if(confVal.begin(), confVal.end(),
  [](char c) {
    return !base::utils::Str::isDigit(c);
  }) == confVal.end();
  if (!valid) {
    valid = false;
    ELPP_ASSERT(valid, "Configuration value not a valid integer [" << confVal << "]");
    return 0;
  }
  return atol(confVal.c_str());
}